

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_regen_hp(player *p)

{
  short sVar1;
  _Bool _Var2;
  wchar_t old_chp;
  wchar_t fed_pct;
  wchar_t percent;
  int32_t hp_gain;
  player *p_local;
  
  old_chp = L'\0';
  sVar1 = p->chp;
  if (p->timed[10] < PY_FOOD_WEAK) {
    if (p->timed[10] < PY_FOOD_FAINT) {
      if (PY_FOOD_STARVE <= p->timed[10]) {
        old_chp = L'!';
      }
    }
    else {
      old_chp = L'b';
    }
  }
  else {
    old_chp = L'Å';
  }
  old_chp = ((((int)p->timed[10] / (int)(uint)z_info->food_value) / 3 + 100) * old_chp) / 100;
  _Var2 = player_of_has(p,L'\f');
  if (_Var2) {
    old_chp = old_chp << 1;
  }
  _Var2 = player_resting_can_regenerate(p);
  if (_Var2) {
    old_chp = old_chp << 1;
  }
  _Var2 = player_of_has(p,L'\x16');
  if (_Var2) {
    old_chp = old_chp / 2;
  }
  if (p->timed[3] != 0) {
    old_chp = L'\0';
  }
  if (p->timed[7] != 0) {
    old_chp = L'\0';
  }
  if (p->timed[9] != 0) {
    old_chp = L'\0';
  }
  if (p->timed[8] != 0) {
    old_chp = L'\0';
  }
  player_adjust_hp_precise(p,p->mhp * old_chp + 0x5a2);
  if (sVar1 != p->chp) {
    equip_learn_flag(p,L'\f');
    equip_learn_flag(p,L'\x16');
  }
  return;
}

Assistant:

void player_regen_hp(struct player *p)
{
	int32_t hp_gain;
	int percent = 0;/* max 32k -> 50% of mhp; more accurately "pertwobytes" */
	int fed_pct, old_chp = p->chp;

	/* Default regeneration */
	if (p->timed[TMD_FOOD] >= PY_FOOD_WEAK) {
		percent = PY_REGEN_NORMAL;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_FAINT) {
		percent = PY_REGEN_WEAK;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_STARVE) {
		percent = PY_REGEN_FAINT;
	}

	/* Food bonus - better fed players regenerate up to 1/3 faster */
	fed_pct = p->timed[TMD_FOOD] / z_info->food_value;
	percent *= 100 + fed_pct / 3;
	percent /= 100;

	/* Various things speed up regeneration */
	if (player_of_has(p, OF_REGEN))
		percent *= 2;
	if (player_resting_can_regenerate(p))
		percent *= 2;

	/* Some things slow it down */
	if (player_of_has(p, OF_IMPAIR_HP))
		percent /= 2;

	/* Various things interfere with physical healing */
	if (p->timed[TMD_PARALYZED]) percent = 0;
	if (p->timed[TMD_POISONED]) percent = 0;
	if (p->timed[TMD_STUN]) percent = 0;
	if (p->timed[TMD_CUT]) percent = 0;

	/* Extract the new hitpoints */
	hp_gain = (int32_t)(p->mhp * percent) + PY_REGEN_HPBASE;
	player_adjust_hp_precise(p, hp_gain);

	/* Notice changes */
	if (old_chp != p->chp) {
		equip_learn_flag(p, OF_REGEN);
		equip_learn_flag(p, OF_IMPAIR_HP);
	}
}